

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void __thiscall ExprTest_NotExpr_Test::~ExprTest_NotExpr_Test(ExprTest_NotExpr_Test *this)

{
  void *in_RDI;
  
  ~ExprTest_NotExpr_Test((ExprTest_NotExpr_Test *)0x14a868);
  operator_delete(in_RDI,0x58);
  return;
}

Assistant:

TEST_F(ExprTest, NotExpr) {
  mp::NotExpr e;
  EXPECT_TRUE(e == 0);
  (void)LogicalExpr(e);
  auto arg = factory_.MakeLogicalConstant(false);
  e = factory_.MakeNot(arg);
  EXPECT_TRUE(e != 0);
  EXPECT_EQ(expr::NOT, e.kind());
  EXPECT_EQ(arg, e.arg());
  EXPECT_ASSERT(factory_.MakeNot(LogicalExpr()), "invalid argument");
}